

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntStateScatter
          (ChNodeFEAxyzD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  double *local_c0;
  undefined8 local_b8;
  ChState *local_a8;
  ulong local_a0;
  long local_90;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  local_a0 = (ulong)off_x;
  local_c0 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_a0;
  local_90 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_b8 = 3;
  local_a8 = x;
  if ((long)local_a0 <= local_90 + -3) {
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_88,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_c0,(type *)0x0);
    if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20 != &local_88)
    {
      *(double *)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20 = local_88.m_data[0];
      *(double *)&(this->super_ChNodeFEAxyz).field_0x28 = local_88.m_data[1];
      *(double *)&(this->super_ChNodeFEAxyz).field_0x30 = local_88.m_data[2];
    }
    local_a0 = (ulong)(off_x + 3);
    local_90 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_c0 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_a0;
    local_b8 = 3;
    local_a8 = x;
    if ((long)local_a0 <= local_90 + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_c0,(type *)0x0);
      if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0xf0 != &local_48) {
        *(double *)&(this->super_ChNodeFEAxyz).field_0xf0 = local_48.m_data[0];
        *(double *)&this->field_0xf8 = local_48.m_data[1];
        *(double *)&this->field_0x100 = local_48.m_data[2];
      }
      local_a0 = (ulong)off_v;
      local_c0 = (v->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_a0;
      local_90 = (v->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_b8 = 3;
      local_a8 = (ChState *)v;
      if ((long)local_a0 <= local_90 + -3) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_88,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_c0,(type *)0x0);
        if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0x38 != &local_88) {
          *(double *)&(this->super_ChNodeFEAxyz).field_0x38 = local_88.m_data[0];
          *(double *)&(this->super_ChNodeFEAxyz).field_0x40 = local_88.m_data[1];
          *(double *)&(this->super_ChNodeFEAxyz).field_0x48 = local_88.m_data[2];
        }
        local_a0 = (ulong)(off_v + 3);
        local_90 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_c0 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   local_a0;
        local_b8 = 3;
        local_a8 = (ChState *)v;
        if ((long)local_a0 <= local_90 + -3) {
          ChVector<double>::
          ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                    (&local_68,
                     (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_c0,(type *)0x0);
          if (&this->D_dt != &local_68) {
            (this->D_dt).m_data[0] = local_68.m_data[0];
            (this->D_dt).m_data[1] = local_68.m_data[1];
            (this->D_dt).m_data[2] = local_68.m_data[2];
          }
          return;
        }
      }
    }
  }
  local_b8 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzD::NodeIntStateScatter(const unsigned int off_x,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
}